

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void glist_nograb(_glist *x)

{
  _glist *in_RAX;
  _glist *p_Var1;
  t_object *x_00;
  t_gobj *x_01;
  
  if (x->gl_editor != (t_editor *)0x0) {
    p_Var1 = glist_getcanvas(in_RAX);
    for (x_01 = p_Var1->gl_list; x_01 != (t_gobj *)0x0; x_01 = x_01->g_next) {
      x_00 = pd_checkobject(&x_01->g_pd);
      if ((x_00 != (t_object *)0x0) && ((~x_00->field_0x2e & 3) == 0)) {
        gatom_undarken(x_00);
      }
    }
    x->gl_editor->e_grab = (t_gobj *)0x0;
  }
  return;
}

Assistant:

static void glist_nograb(t_glist *x)
{
    if (x->gl_editor)
    {
        t_canvas *canvas = glist_getcanvas(x);
        t_object *ob;
        t_gobj*g;
        for (g = canvas->gl_list; g; g = g->g_next)
            if ((ob = pd_checkobject(&g->g_pd)) && T_ATOM == ob->te_type)
                gatom_undarken(ob);
        x->gl_editor->e_grab = 0;
    }
}